

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_short(string *current,string *name,string *rest)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *rest_local;
  string *name_local;
  string *current_local;
  
  local_28 = rest;
  rest_local = name;
  name_local = current;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (current);
  if ((1 < sVar2) &&
     (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](name_local,0), *pvVar3 == '-')) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](name_local,1);
    bVar1 = valid_first_char<char>(*pvVar3);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,name_local,1,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (rest_local,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_68,name_local,2,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (local_28,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      return true;
    }
  }
  return false;
}

Assistant:

inline bool split_short(const std::string &current, std::string &name, std::string &rest) {
    if(current.size() > 1 && current[0] == '-' && valid_first_char(current[1])) {
        name = current.substr(1, 1);
        rest = current.substr(2);
        return true;
    }
    return false;
}